

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

pair<glm::vec<2,_int,_(glm::qualifier)0>,_float>
vera::FindCandidate(Image *_image,ivec2 p0,ivec2 p1,ivec2 p2)

{
  bool bVar1;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar6;
  int iVar7;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar8;
  uint uVar9;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar10;
  uint uVar11;
  ulong uVar12;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar17;
  int iVar18;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar19;
  int iVar20;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar21;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar22;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar29;
  pair<glm::vec<2,_int,_(glm::qualifier)0>,_float> pVar30;
  float local_dc;
  uint local_c0;
  ulong local_90;
  
  aVar23 = p1.field_0;
  aVar13 = p0.field_0;
  aVar19.x = aVar13.x;
  if (aVar23.x < aVar13.x) {
    aVar19.x = aVar23.x;
  }
  aVar22 = p1.field_1;
  aVar17 = p0.field_1;
  aVar6.y = aVar17.y;
  if (aVar22.y < aVar17.y) {
    aVar6.y = aVar22.y;
  }
  aVar10 = p2.field_0;
  if (aVar10.x < aVar19.x) {
    aVar19.x = aVar10.x;
  }
  aVar21 = p2.field_1;
  if (aVar21.y < aVar6.y) {
    aVar6.y = aVar21.y;
  }
  aVar8.x = aVar23.x;
  if (aVar13.x - aVar23.x != 0 && aVar23.x <= aVar13.x) {
    aVar8.x = aVar13.x;
  }
  aVar2.y = aVar22.y;
  if (aVar17.y - aVar22.y != 0 && aVar22.y <= aVar17.y) {
    aVar2.y = aVar17.y;
  }
  iVar18 = -(aVar17.y - aVar22.y);
  if (aVar8.x <= aVar10.x) {
    aVar8.x = aVar10.x;
  }
  if (aVar2.y <= aVar21.y) {
    aVar2.y = aVar21.y;
  }
  iVar15 = (aVar19.x - aVar23.x) * (aVar21.y - aVar6.y) +
           (aVar10.x - aVar19.x) * (aVar22.y - aVar6.y);
  iVar7 = (aVar19.x - aVar10.x) * (aVar17.y - aVar6.y) +
          (aVar13.x - aVar19.x) * (aVar21.y - aVar6.y);
  iVar26 = aVar17.y - aVar21.y;
  fVar28 = (float)((aVar22.y - aVar21.y) * (aVar10.x - aVar13.x) + iVar26 * (aVar23.x - aVar10.x));
  iVar20 = (aVar19.x - aVar13.x) * (aVar22.y - aVar6.y) +
           (aVar23.x - aVar19.x) * (aVar17.y - aVar6.y);
  iVar3 = aVar21.y - aVar22.y;
  iVar4 = (*_image->_vptr_Image[0xe])(_image,(long)aVar13.x);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var,iVar4));
  uVar25 = (long)p1 >> 0x20;
  iVar4 = (*_image->_vptr_Image[0xe])(_image,(long)aVar23.x,uVar25);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_00,iVar4));
  uVar12 = (long)p2 >> 0x20;
  iVar4 = (*_image->_vptr_Image[0xe])(_image,(long)aVar10.x,uVar12);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_01,iVar4));
  if ((long)p0 >> 0x20 < (long)uVar25) {
    uVar25 = (long)p0 >> 0x20;
  }
  if ((long)uVar12 <= (long)uVar25) {
    uVar25 = uVar12;
  }
  local_dc = 0.0;
  local_c0 = 0;
  local_90 = 0;
  do {
    if ((long)aVar2.y < (long)uVar25) {
      iVar18 = (int)local_90;
      if ((((local_c0 == aVar13.x) && (iVar18 == aVar17.y)) ||
          ((local_c0 == aVar23.x && (iVar18 == aVar22.y)))) ||
         ((local_c0 == aVar10.x && (iVar18 == aVar21.y)))) {
        local_dc = 0.0;
      }
      pVar30.first = (vec<2,_int,_(glm::qualifier)0>)((ulong)local_c0 | local_90 << 0x20);
      pVar30.second = local_dc;
      return pVar30;
    }
    iVar4 = 0;
    if ((iVar15 < 0 && (ulong)p2 >> 0x20 != (ulong)p1 >> 0x20) &&
       (iVar4 = -(iVar15 / iVar3), -1 < iVar15 / iVar3)) {
      iVar4 = 0;
    }
    if ((iVar7 < 0 && (ulong)p0 >> 0x20 != (ulong)p2 >> 0x20) &&
       (iVar5 = -(iVar7 / iVar26),
       iVar4 == iVar5 || SBORROW4(iVar4,iVar5) != iVar4 + iVar7 / iVar26 < 0)) {
      iVar4 = iVar5;
    }
    if ((iVar20 < 0 && (ulong)p1 >> 0x20 != (ulong)p0 >> 0x20) &&
       (iVar5 = -(iVar20 / iVar18),
       iVar4 == iVar5 || SBORROW4(iVar4,iVar5) != iVar4 + iVar20 / iVar18 < 0)) {
      iVar4 = iVar5;
    }
    uVar9 = iVar4 * iVar3 + iVar15;
    uVar16 = iVar4 * iVar26 + iVar7;
    uVar11 = iVar4 * iVar18 + iVar20;
    uVar24 = iVar4 + aVar19.x;
    bVar1 = false;
    for (lVar14 = (long)(int)uVar24; lVar14 <= aVar8.x; lVar14 = lVar14 + 1) {
      bVar27 = (int)(uVar9 | uVar16 | uVar11) < 0;
      if (bVar27) {
        if (bVar1) break;
      }
      else {
        iVar4 = (*_image->_vptr_Image[0xe])(_image,lVar14,uVar25);
        (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_02,iVar4));
        fVar29 = ABS(((float)(int)uVar11 * (extraout_XMM0_Da_01 / fVar28) +
                     (float)(int)uVar16 * (extraout_XMM0_Da_00 / fVar28) +
                     (float)(int)uVar9 * (extraout_XMM0_Da / fVar28)) - extraout_XMM0_Da_02);
        if (local_dc < fVar29) {
          local_90 = uVar25 & 0xffffffff;
          local_dc = fVar29;
          local_c0 = uVar24;
        }
      }
      uVar9 = uVar9 + iVar3;
      uVar16 = uVar16 + iVar26;
      uVar11 = uVar11 + iVar18;
      uVar24 = uVar24 + 1;
      bVar1 = !bVar27;
    }
    iVar15 = iVar15 + (aVar23.x - aVar10.x);
    iVar7 = iVar7 + (aVar10.x - aVar13.x);
    iVar20 = iVar20 + (aVar13.x - aVar23.x);
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

std::pair<glm::ivec2, float> FindCandidate( const Image& _image, const glm::ivec2 p0, const glm::ivec2 p1, const glm::ivec2 p2) { 
    
    const auto edge = []( const glm::ivec2 a, const glm::ivec2 b, const glm::ivec2 c) {
        return (b.x - c.x) * (a.y - c.y) - (b.y - c.y) * (a.x - c.x);
    };

    // triangle bounding box
    const glm::ivec2 min = glm::min(glm::min(p0, p1), p2);
    const glm::ivec2 max = glm::max(glm::max(p0, p1), p2);

    // forward differencing variables
    int w00 = edge(p1, p2, min);
    int w01 = edge(p2, p0, min);
    int w02 = edge(p0, p1, min);
    const int a01 = p1.y - p0.y;
    const int b01 = p0.x - p1.x;
    const int a12 = p2.y - p1.y;
    const int b12 = p1.x - p2.x;
    const int a20 = p0.y - p2.y;
    const int b20 = p2.x - p0.x;

    // pre-multiplied z values at vertices
    const float a = edge(p0, p1, p2);
    const float z0 = _image.getValue( _image.getIndex(p0.x, p0.y) ) / a;
    const float z1 = _image.getValue( _image.getIndex(p1.x, p1.y) ) / a;
    const float z2 = _image.getValue( _image.getIndex(p2.x, p2.y) ) / a;

    // iterate over pixels in bounding box
    float maxError = 0;
    glm::ivec2 maxPoint(0);
    for (int y = min.y; y <= max.y; y++) {
        // compute starting offset
        int dx = 0;
        if (w00 < 0 && a12 != 0)
            dx = std::max(dx, -w00 / a12);
        if (w01 < 0 && a20 != 0)
            dx = std::max(dx, -w01 / a20);
        if (w02 < 0 && a01 != 0)
            dx = std::max(dx, -w02 / a01);

        int w0 = w00 + a12 * dx;
        int w1 = w01 + a20 * dx;
        int w2 = w02 + a01 * dx;

        bool wasInside = false;

        for (int x = min.x + dx; x <= max.x; x++) {
            // check if inside triangle
            if (w0 >= 0 && w1 >= 0 && w2 >= 0) {
                wasInside = true;

                // compute z using barycentric coordinates
                const float z = z0 * w0 + z1 * w1 + z2 * w2;
                const float dz = std::abs(z - _image.getValue( _image.getIndex(x, y) ) );
                if (dz > maxError) {
                    maxError = dz;
                    maxPoint = glm::ivec2(x, y);
                }
            } else if (wasInside) {
                break;
            }

            w0 += a12;
            w1 += a20;
            w2 += a01;
        }

        w00 += b12;
        w01 += b20;
        w02 += b01;
    }

    if (maxPoint == p0 || maxPoint == p1 || maxPoint == p2) {
        maxError = 0;
    }

    return std::make_pair(maxPoint, maxError);
}